

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaB_rawget(lua_State *L)

{
  luaL_checktype(L,1,5);
  luaL_checkany(L,2);
  lua_settop(L,2);
  lua_rawget(L,1);
  return 1;
}

Assistant:

static int luaB_rawget(lua_State*L){
luaL_checktype(L,1,5);
luaL_checkany(L,2);
lua_settop(L,2);
lua_rawget(L,1);
return 1;
}